

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O0

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,IndexedMatrixArray *u,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedMatrixArray *ino,IndexedMatrixArray *premea)

{
  uint uVar1;
  uint uVar2;
  const_reference other;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other_00;
  undefined4 in_register_0000000c;
  IndexedMatrixArray *in_stack_00000010;
  Matrix<double,__1,_1,_0,__1,_1> local_7c8;
  Matrix local_7b8;
  Matrix<double,__1,_1,_0,__1,_1> local_7a0;
  Matrix local_790;
  Matrix local_778;
  Matrix local_760;
  Matrix<double,__1,_1,_0,__1,_1> local_748;
  Matrix local_738;
  Matrix<double,__1,_1,_0,__1,_1> local_720;
  uint local_710;
  undefined1 local_709;
  uint i_1;
  uint local_6ec;
  undefined1 local_6e8 [4];
  uint i;
  double local_6b0;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  local_6a3 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_6a0;
  Type local_680;
  double local_648;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  local_63b [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_638;
  double local_618;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_610;
  undefined1 local_5e8 [8];
  Matrix Q;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_5c8;
  undefined1 local_590 [8];
  Matrix R;
  FixedContactEKFFlexEstimatorIMU estimator;
  double dt_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *contactsPositions_local;
  uint numberOfContacts_local;
  Matrix *xh0_local;
  IndexedMatrixArray *u_local;
  IndexedMatrixArray *y_local;
  IndexedMatrixArray *xh;
  
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU
            ((FixedContactEKFFlexEstimatorIMU *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  Q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3c9cd2b297d889bc;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_5c8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_590,
             (double *)
             &Q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_590,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_5c8);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getQmatrixIdentity();
  local_618 = 0.0001;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_610,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5e8,&local_618);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_5e8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_610);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_648 = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_638,local_63b,&local_648);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_680,local_5e8,6,6,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_680,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_638);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_6b0 = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_6a0,local_6a3,&local_6b0);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((Type *)local_6e8,local_5e8,0xf,0xf,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)local_6e8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_6a0);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setFlexibilityCovariance
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  setProcessNoiseCovariance
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactsNumber
            ((int)&R + 0x10);
  for (local_6ec = 0; uVar1 = local_6ec, local_6ec < (uint)contactsPositions;
      local_6ec = local_6ec + 1) {
    other = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)ino,(ulong)local_6ec);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&i_1,other);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setContactPosition
              (&R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               uVar1,&i_1);
  }
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_709 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(y);
  uVar1 = IndexedMatrixArray::getFirstIndex(u);
  IndexedMatrixArray::setValue
            (y,(Matrix *)CONCAT44(in_register_0000000c,numberOfContacts),uVar1 - 1);
  for (local_710 = IndexedMatrixArray::getFirstIndex(u); uVar1 = local_710,
      uVar2 = IndexedMatrixArray::getLastIndex(u), uVar1 <= uVar2; local_710 = local_710 + 1) {
    IndexedMatrixArray::operator[](&local_738,u,local_710);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_720,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_738);
    stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)
               &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_720);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_738);
    IndexedMatrixArray::operator[](&local_760,(IndexedMatrixArray *)xh0,local_710);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_748,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_760);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)
               &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_748);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_760);
    other_00 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
               getFlexibilityVector();
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_778,other_00);
    IndexedMatrixArray::pushBack(y,&local_778);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_778);
    if (premea != (IndexedMatrixArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInovation();
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_790,
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_7a0);
      IndexedMatrixArray::setValue(premea,&local_790,local_710);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_790);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_7a0);
    }
    if (in_stack_00000010 != (IndexedMatrixArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getPredictedMeasurement
                ();
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_7b8,
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_7c8);
      IndexedMatrixArray::setValue(in_stack_00000010,&local_7b8,local_710);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_7b8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_7c8);
    }
  }
  local_709 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_5e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_590);
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  ~FixedContactEKFFlexEstimatorIMU
            ((FixedContactEKFFlexEstimatorIMU *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  return y;
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const stateObservation::IndexedMatrixArray & u,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedMatrixArray * ino,
            IndexedMatrixArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-16;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-2;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-2;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getPredictedMeasurement(),i);
        }

    }

    return xh;
}